

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# convolve.c
# Opt level: O3

void av1_highbd_convolve_2d_scale_c
               (uint16_t *src,int src_stride,uint16_t *dst,int dst_stride,int w,int h,
               InterpFilterParams *filter_params_x,InterpFilterParams *filter_params_y,
               int subpel_x_qn,int x_step_qn,int subpel_y_qn,int y_step_qn,
               ConvolveParams *conv_params,int bd)

{
  ushort uVar1;
  ushort uVar2;
  int16_t *piVar3;
  CONV_BUF_TYPE *pCVar4;
  byte bVar5;
  int iVar6;
  ulong uVar7;
  byte bVar8;
  byte bVar9;
  uint16_t uVar10;
  uint uVar11;
  int iVar12;
  uint uVar13;
  uint uVar14;
  int iVar15;
  ulong uVar16;
  long lVar17;
  short *psVar18;
  ulong uVar19;
  undefined2 *puVar20;
  int iVar21;
  int iVar22;
  bool bVar23;
  ulong uStack_10c98;
  ulong uStack_10c70;
  undefined2 auStack_10c38 [34308];
  
  iVar12 = (h + -1) * y_step_qn + subpel_y_qn >> 10;
  uVar1 = filter_params_y->taps;
  iVar6 = (uVar1 >> 1) - 1;
  uVar7 = (ulong)(uint)w;
  uVar13 = iVar12 + (uint)uVar1;
  bVar9 = (byte)conv_params->round_0;
  if (uVar13 != 0 && SCARRY4(iVar12,(uint)uVar1) == (int)uVar13 < 0) {
    iVar12 = 1 << ((char)bd + 6U & 0x1f);
    uVar2 = filter_params_x->taps;
    lVar17 = (long)src + (2 - ((ulong)(uVar2 & 0xfffffffe) + (long)(iVar6 * src_stride) * 2));
    uStack_10c98 = 0;
    do {
      if (0 < w) {
        piVar3 = filter_params_x->filter_ptr;
        uVar19 = 0;
        uVar14 = subpel_x_qn;
        do {
          iVar15 = iVar12;
          if ((ulong)uVar2 != 0) {
            uVar16 = 0;
            do {
              iVar15 = iVar15 + (uint)*(ushort *)
                                       (lVar17 + (long)((int)uVar14 >> 10) * 2 + uVar16 * 2) *
                                (int)piVar3[(uVar14 >> 6 & 0xf) * (uint)uVar2 + uVar16];
              uVar16 = uVar16 + 1;
            } while (uVar2 != uVar16);
          }
          auStack_10c38[uVar19 + uStack_10c98 * uVar7] =
               (short)(iVar15 + ((1 << (bVar9 & 0x1f)) >> 1) >> (bVar9 & 0x1f));
          uVar19 = uVar19 + 1;
          uVar14 = uVar14 + x_step_qn;
        } while (uVar19 != uVar7);
      }
      uStack_10c98 = uStack_10c98 + 1;
      lVar17 = lVar17 + (long)src_stride * 2;
    } while (uStack_10c98 != uVar13);
  }
  if (0 < w) {
    bVar5 = (byte)conv_params->round_1;
    bVar8 = ('\x0e' - bVar9) - bVar5;
    pCVar4 = conv_params->dst;
    iVar12 = conv_params->dst_stride;
    bVar9 = ((char)bd - bVar9) + 0xe;
    iVar22 = 1 << (bVar9 & 0x1f);
    bVar9 = bVar9 - bVar5;
    iVar15 = ((1 << (bVar8 & 0x1f)) >> 1) + (-1 << (bVar9 & 0x1f)) + (-1 << (bVar9 - 1 & 0x1f));
    puVar20 = auStack_10c38 + (1 - (ulong)(uVar1 >> 1)) * uVar7 + (long)(iVar6 * w);
    uStack_10c70 = 0;
    do {
      if (0 < h) {
        piVar3 = filter_params_y->filter_ptr;
        iVar6 = conv_params->is_compound;
        uVar19 = 0;
        uVar13 = subpel_y_qn;
        do {
          uVar1 = filter_params_y->taps;
          iVar21 = iVar22;
          if (uVar1 != 0) {
            psVar18 = puVar20 + ((int)uVar13 >> 10) * w;
            uVar16 = 0;
            do {
              iVar21 = iVar21 + (int)*psVar18 *
                                (int)piVar3[(uVar13 >> 6 & 0xf) * (uint)uVar1 + uVar16];
              uVar16 = uVar16 + 1;
              psVar18 = psVar18 + uVar7;
            } while (uVar1 != uVar16);
          }
          uVar14 = iVar21 + ((1 << (bVar5 & 0x1f)) >> 1) >> (bVar5 & 0x1f);
          if (iVar6 == 0) {
            uVar14 = (int)((uVar14 & 0xffff) + iVar15) >> (bVar8 & 0x1f);
            if (bd != 10) goto LAB_0039f342;
LAB_0039f305:
            bVar23 = uVar14 < 0x3ff;
            uVar10 = 0x3ff;
LAB_0039f363:
            if (bVar23) {
              uVar10 = (uint16_t)uVar14;
            }
            if ((int)uVar14 < 0) {
              uVar10 = 0;
            }
            dst[uStack_10c70 + uVar19 * (long)dst_stride] = uVar10;
          }
          else {
            lVar17 = uVar19 * (long)iVar12;
            if (conv_params->do_average != 0) {
              uVar11 = (uint)pCVar4[uStack_10c70 + lVar17];
              if (conv_params->use_dist_wtd_comp_avg == 0) {
                uVar14 = (uVar14 & 0xffff) + uVar11 >> 1;
              }
              else {
                uVar14 = (int)((uVar14 & 0xffff) * conv_params->bck_offset +
                              uVar11 * conv_params->fwd_offset) >> 4;
              }
              uVar14 = (int)(uVar14 + iVar15) >> (bVar8 & 0x1f);
              if (bd == 10) goto LAB_0039f305;
LAB_0039f342:
              if (bd == 0xc) {
                bVar23 = uVar14 < 0xfff;
                uVar10 = 0xfff;
              }
              else {
                bVar23 = uVar14 < 0xff;
                uVar10 = 0xff;
              }
              goto LAB_0039f363;
            }
            pCVar4[uStack_10c70 + lVar17] = (CONV_BUF_TYPE)uVar14;
          }
          uVar19 = uVar19 + 1;
          uVar13 = uVar13 + y_step_qn;
        } while (uVar19 != (uint)h);
      }
      uStack_10c70 = uStack_10c70 + 1;
      puVar20 = puVar20 + 1;
    } while (uStack_10c70 != uVar7);
  }
  return;
}

Assistant:

void av1_highbd_convolve_2d_scale_c(const uint16_t *src, int src_stride,
                                    uint16_t *dst, int dst_stride, int w, int h,
                                    const InterpFilterParams *filter_params_x,
                                    const InterpFilterParams *filter_params_y,
                                    const int subpel_x_qn, const int x_step_qn,
                                    const int subpel_y_qn, const int y_step_qn,
                                    ConvolveParams *conv_params, int bd) {
  int16_t im_block[(2 * MAX_SB_SIZE + MAX_FILTER_TAP) * MAX_SB_SIZE];
  int im_h = (((h - 1) * y_step_qn + subpel_y_qn) >> SCALE_SUBPEL_BITS) +
             filter_params_y->taps;
  int im_stride = w;
  const int fo_vert = filter_params_y->taps / 2 - 1;
  const int fo_horiz = filter_params_x->taps / 2 - 1;
  CONV_BUF_TYPE *dst16 = conv_params->dst;
  const int dst16_stride = conv_params->dst_stride;
  const int bits =
      FILTER_BITS * 2 - conv_params->round_0 - conv_params->round_1;
  assert(bits >= 0);
  // horizontal filter
  const uint16_t *src_horiz = src - fo_vert * src_stride;
  for (int y = 0; y < im_h; ++y) {
    int x_qn = subpel_x_qn;
    for (int x = 0; x < w; ++x, x_qn += x_step_qn) {
      const uint16_t *const src_x = &src_horiz[(x_qn >> SCALE_SUBPEL_BITS)];
      const int x_filter_idx = (x_qn & SCALE_SUBPEL_MASK) >> SCALE_EXTRA_BITS;
      assert(x_filter_idx < SUBPEL_SHIFTS);
      const int16_t *x_filter =
          av1_get_interp_filter_subpel_kernel(filter_params_x, x_filter_idx);
      int32_t sum = (1 << (bd + FILTER_BITS - 1));
      for (int k = 0; k < filter_params_x->taps; ++k) {
        sum += x_filter[k] * src_x[k - fo_horiz];
      }
      assert(filter_params_x->taps > 8 ||
             (0 <= sum && sum < (1 << (bd + FILTER_BITS + 1))));
      im_block[y * im_stride + x] =
          (int16_t)ROUND_POWER_OF_TWO(sum, conv_params->round_0);
    }
    src_horiz += src_stride;
  }

  // vertical filter
  int16_t *src_vert = im_block + fo_vert * im_stride;
  const int offset_bits = bd + 2 * FILTER_BITS - conv_params->round_0;
  for (int x = 0; x < w; ++x) {
    int y_qn = subpel_y_qn;
    for (int y = 0; y < h; ++y, y_qn += y_step_qn) {
      const int16_t *src_y = &src_vert[(y_qn >> SCALE_SUBPEL_BITS) * im_stride];
      const int y_filter_idx = (y_qn & SCALE_SUBPEL_MASK) >> SCALE_EXTRA_BITS;
      assert(y_filter_idx < SUBPEL_SHIFTS);
      const int16_t *y_filter =
          av1_get_interp_filter_subpel_kernel(filter_params_y, y_filter_idx);
      int32_t sum = 1 << offset_bits;
      for (int k = 0; k < filter_params_y->taps; ++k) {
        sum += y_filter[k] * src_y[(k - fo_vert) * im_stride];
      }
      assert(filter_params_y->taps > 8 ||
             (0 <= sum && sum < (1 << (offset_bits + 2))));
      CONV_BUF_TYPE res = ROUND_POWER_OF_TWO(sum, conv_params->round_1);
      if (conv_params->is_compound) {
        if (conv_params->do_average) {
          int32_t tmp = dst16[y * dst16_stride + x];
          if (conv_params->use_dist_wtd_comp_avg) {
            tmp = tmp * conv_params->fwd_offset + res * conv_params->bck_offset;
            tmp = tmp >> DIST_PRECISION_BITS;
          } else {
            tmp += res;
            tmp = tmp >> 1;
          }
          /* Subtract round offset and convolve round */
          tmp = tmp - ((1 << (offset_bits - conv_params->round_1)) +
                       (1 << (offset_bits - conv_params->round_1 - 1)));
          dst[y * dst_stride + x] =
              clip_pixel_highbd(ROUND_POWER_OF_TWO(tmp, bits), bd);
        } else {
          dst16[y * dst16_stride + x] = res;
        }
      } else {
        /* Subtract round offset and convolve round */
        int32_t tmp = res - ((1 << (offset_bits - conv_params->round_1)) +
                             (1 << (offset_bits - conv_params->round_1 - 1)));
        dst[y * dst_stride + x] =
            clip_pixel_highbd(ROUND_POWER_OF_TWO(tmp, bits), bd);
      }
    }
    src_vert++;
  }
}